

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_stats.hpp
# Opt level: O1

string * __thiscall
duckdb::StringStatisticsState::TruncateMin_abi_cxx11_
          (string *__return_storage_ptr__,StringStatisticsState *this,string_t str,idx_t max_size)

{
  long lVar1;
  undefined8 local_18;
  long local_10;
  
  local_10 = str.value._8_8_;
  local_18 = str.value._0_8_;
  lVar1 = local_10;
  if (str.value._0_4_ < 0xd) {
    lVar1 = (long)&local_18 + 4;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,lVar1,max_size + lVar1);
  return __return_storage_ptr__;
}

Assistant:

bool HasNaN() override {
		return has_nan;
	}